

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  char cVar1;
  UInt64 UVar2;
  UInt64 UVar3;
  Byte *pBVar4;
  ILookInStream *pIVar5;
  int __result__;
  SRes SVar6;
  SRes SVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  UInt32 UVar11;
  ulong uVar12;
  ulong uVar13;
  ISzAlloc *pIVar14;
  ISzAlloc *pIVar15;
  byte bVar16;
  ISzAlloc *pIVar17;
  Byte *pBVar18;
  Byte BVar19;
  long lVar20;
  uint uVar21;
  UInt32 *value;
  ulong uVar22;
  Byte *pBVar23;
  Byte *pBVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ISzAlloc *src;
  ISzAlloc *pIVar28;
  ulong __n;
  size_t __n_00;
  UInt64 inSize;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  SizeT inProcessed;
  void *inBuf;
  Byte coderUsed [4];
  CSzFolder folder;
  Byte *tempBuf [3];
  UInt32 numStreams;
  UInt32 numCoders;
  uint local_51c;
  ELzmaStatus local_504;
  ISzAlloc *local_500;
  ISzAlloc *local_4f8;
  CSzAr *local_4f0;
  CSzData local_4e8;
  ISzAlloc *local_4d8;
  UInt64 *local_4d0;
  ISzAlloc *local_4c8;
  ISzAlloc *local_4c0;
  ISzAlloc *local_4b8;
  ulong local_4b0;
  ISzAlloc *local_4a8;
  ILookInStream *local_4a0;
  ulong local_498 [2];
  UInt64 local_488;
  ISzAlloc *local_478;
  UInt32 local_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  uint local_458 [4];
  UInt32 local_448 [5];
  int local_434;
  ISzAlloc local_430;
  int local_418;
  char local_414;
  char acStack_413 [11];
  int local_408;
  char local_404;
  int local_3f8;
  char local_3f4;
  ISzAlloc *local_3e8;
  UInt64 local_3e0;
  Byte *local_3d8 [2];
  ISzAlloc *local_3c8;
  Byte *local_3b8;
  UInt64 *local_3b0;
  CBcj2Dec local_3a8;
  undefined8 local_138;
  
  uVar22 = (ulong)folderIndex;
  local_4e8.Size = p->FoCodersOffsets[uVar22];
  local_4e8.Data = p->CodersData + local_4e8.Size;
  local_4e8.Size = p->FoCodersOffsets[uVar22 + 1] - local_4e8.Size;
  local_468 = 0;
  uStack_460 = 0;
  local_4a8 = (ISzAlloc *)local_4e8.Data;
  local_4a0 = inStream;
  local_46c = folderIndex;
  local_3e0 = startPos;
  SVar6 = SzReadNumber32(&local_4e8,(UInt32 *)&local_138);
  pBVar4 = local_138;
  iVar27 = SVar6;
  if (SVar6 == 0) {
    uVar8 = (uint)local_138;
    uVar12 = (ulong)local_138 & 0xffffffff;
    iVar27 = 4;
    if (0xfffffffb < (uint)local_138 - 5) {
      local_4f8 = (ISzAlloc *)outSize;
      local_4b0 = uVar22;
      if ((uint)local_138 == 0) {
        uVar9 = 0;
      }
      else {
        uVar25 = 0;
        uVar9 = 0;
        do {
          pIVar14 = (ISzAlloc *)local_4e8.Data;
          if (local_4e8.Size == 0) {
LAB_00110919:
            local_4e8.Data = (Byte *)pIVar14;
            bVar31 = false;
            SVar6 = 0x10;
            goto LAB_00110921;
          }
          local_4e8.Size = local_4e8.Size - 1;
          pIVar14 = (ISzAlloc *)((long)(_func_void_ptr_void_ptr_size_t **)local_4e8.Data + 1);
          bVar16 = *(byte *)(_func_void_ptr_void_ptr_size_t **)local_4e8.Data;
          if (bVar16 < 0x40) {
            uVar10 = bVar16 & 0xf;
            if (8 < uVar10) goto LAB_0011090a;
            if (local_4e8.Size < uVar10) goto LAB_00110919;
            if ((bVar16 & 0xf) == 0) {
              uVar22 = 0;
              local_4e8.Data = (Byte *)pIVar14;
            }
            else {
              lVar20 = 0;
              uVar22 = 0;
              do {
                uVar22 = (ulong)*(byte *)((long)&pIVar14->Alloc + lVar20) | uVar22 << 8;
                lVar20 = lVar20 + 1;
              } while (uVar10 != (uint)lVar20);
              local_4e8.Size = local_4e8.Size - lVar20;
              local_4e8.Data =
                   (Byte *)((long)(_func_void_ptr_void_ptr_size_t **)local_4e8.Data +
                           (ulong)(uVar10 - 1) + 2);
            }
            pIVar14 = (ISzAlloc *)local_4e8.Data;
            if (uVar22 >> 0x20 != 0) goto LAB_0011090a;
            *(int *)&(&local_430)[uVar25].Free = (int)uVar22;
            *(undefined2 *)((long)&(&local_430)[uVar25].Free + 4) = 1;
            (&local_430)[uVar25].Alloc = (_func_void_ptr_void_ptr_size_t *)0x0;
            local_4f0 = p;
            if ((bVar16 & 0x10) != 0) {
              SVar7 = SzReadNumber32(&local_4e8,(UInt32 *)&local_3a8);
              if (SVar7 == 0) {
                if (7 < (uint)local_3a8.bufs[0]) {
                  SVar7 = 4;
                  goto LAB_001109ee;
                }
                *(char *)((long)&(&local_430)[uVar25].Free + 4) = (char)local_3a8.bufs[0];
                SVar7 = SzReadNumber32(&local_4e8,(UInt32 *)&local_3a8);
                if (SVar7 != 0) goto LAB_001109ee;
                bVar31 = (uint)local_3a8.bufs[0] == 1;
                if (!bVar31) {
                  SVar6 = 4;
                }
              }
              else {
LAB_001109ee:
                SVar6 = SVar7;
                bVar31 = false;
              }
              if (bVar31) goto LAB_00110a00;
              goto LAB_00110a8c;
            }
LAB_00110a00:
            uVar9 = uVar9 + *(byte *)((long)&(&local_430)[uVar25].Free + 4);
            p = local_4f0;
            if (uVar9 < 8) {
              bVar31 = true;
              if (0x1f < bVar16) {
                local_3a8.bufs[0] = (Byte *)((ulong)local_3a8.bufs[0] & 0xffffffff00000000);
                SVar7 = SzReadNumber32(&local_4e8,(UInt32 *)&local_3a8);
                pBVar24 = local_3a8.bufs[0];
                p = local_4f0;
                if (SVar7 == 0) {
                  uVar22 = (ulong)local_3a8.bufs[0] & 0xffffffff;
                  if (local_4e8.Size < uVar22) {
                    SVar6 = 0x10;
                  }
                  else {
                    if ((uint)local_3a8.bufs[0] < 0x80) {
                      (&local_430)[uVar25].Alloc =
                           (_func_void_ptr_void_ptr_size_t *)
                           ((long)local_4e8.Data - (long)local_4a8);
                      *(char *)((long)&(&local_430)[uVar25].Free + 5) = (char)pBVar24;
                      local_4e8.Data =
                           (Byte *)((long)(_func_void_ptr_void_ptr_size_t **)local_4e8.Data + uVar22
                                   );
                      bVar31 = true;
                      local_4e8.Size = local_4e8.Size - uVar22;
                      goto LAB_00110921;
                    }
                    SVar6 = 4;
                  }
LAB_00110a8c:
                  bVar31 = false;
                  p = local_4f0;
                }
                else {
                  bVar31 = false;
                  SVar6 = SVar7;
                }
              }
            }
            else {
              bVar31 = false;
              SVar6 = 4;
            }
          }
          else {
LAB_0011090a:
            local_4e8.Data = (Byte *)pIVar14;
            bVar31 = false;
            SVar6 = 4;
          }
LAB_00110921:
          uVar22 = local_4b0;
          outSize = (size_t)local_4f8;
          iVar27 = SVar6;
          if (!bVar31) goto LAB_00110b25;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar12);
      }
      outSize = (size_t)local_4f8;
      uVar10 = uVar8 - 1;
      if (uVar9 < uVar10) {
        bVar31 = false;
        SVar6 = 0x10;
      }
      else {
        if (uVar10 < 4) {
          uVar22 = (ulong)uVar9;
          local_468 = CONCAT44(uVar10,(int)local_468);
          uVar21 = uVar9 - uVar10;
          if (uVar21 < 5) {
            uStack_460 = CONCAT44(uStack_460._4_4_,uVar21);
            local_500 = (ISzAlloc *)CONCAT44(local_500._4_4_,uVar10);
            if (uVar22 != 0) {
              memset(&local_3a8,0,uVar22);
              uVar10 = (uint)local_500;
            }
            if (uVar10 != 0) {
              local_4d0 = (UInt64 *)(ulong)uVar21;
              if (uVar8 != 0) {
                memset(local_498,0,uVar12);
                uVar10 = (uint)local_500;
              }
              uVar25 = (ulong)(uVar10 + (uVar10 == 0));
              value = local_448 + 1;
              do {
                SVar7 = SzReadNumber32(&local_4e8,value + -1);
                if (SVar7 == 0) {
                  uVar10 = value[-1];
                  if ((uVar10 < uVar9) && (*(char *)((long)local_3a8.bufs + (ulong)uVar10) == '\0'))
                  {
                    *(undefined1 *)((long)local_3a8.bufs + (ulong)uVar10) = 1;
                    SVar7 = SzReadNumber32(&local_4e8,value);
                    if (SVar7 != 0) goto LAB_00110cc9;
                    uVar10 = *value;
                    if (uVar10 < uVar8) {
                      cVar1 = *(char *)((long)local_498 + (ulong)uVar10);
                      bVar31 = cVar1 == '\0';
                      *(char *)((long)local_498 + (ulong)uVar10) = cVar1 + (cVar1 == '\0');
                      if (!bVar31) {
                        SVar6 = 0x10;
                      }
                    }
                    else {
                      bVar31 = false;
                      SVar6 = 0x10;
                    }
                  }
                  else {
                    bVar31 = false;
                    SVar6 = 0x10;
                  }
                }
                else {
LAB_00110cc9:
                  SVar6 = SVar7;
                  bVar31 = false;
                }
                if (!bVar31) {
                  bVar31 = false;
                  goto LAB_001121be;
                }
                value = value + 2;
                uVar25 = uVar25 - 1;
              } while (uVar25 != 0);
              uVar25 = 0;
              if (uVar8 != 0) {
                do {
                  if (*(char *)((long)local_498 + uVar25) == '\0') {
                    uStack_460 = CONCAT44((int)uVar25,(int)uStack_460);
                    goto LAB_001121af;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar12 != uVar25);
                uVar25 = (ulong)pBVar4 & 0xffffffff;
              }
LAB_001121af:
              bVar31 = (uint)uVar25 != uVar8;
              if (!bVar31) {
                SVar6 = 0x10;
              }
LAB_001121be:
              uVar21 = (uint)local_4d0;
              outSize = (size_t)local_4f8;
              if (!bVar31) {
                bVar31 = false;
                goto LAB_00110b02;
              }
              uVar10 = (uint)local_500;
            }
            if (uVar21 == 1) {
              uVar25 = 0;
              uVar12 = uVar25;
              if (uVar22 != 0) {
                do {
                  uVar12 = uVar25;
                  if (*(char *)((long)local_3a8.bufs + uVar25) == '\0') break;
                  uVar25 = uVar25 + 1;
                  uVar12 = uVar22;
                } while (uVar22 != uVar25);
              }
              if ((uint)uVar12 == uVar9) {
                bVar31 = false;
                SVar6 = 0x10;
              }
              else {
                local_458[0] = (uint)uVar12;
                bVar31 = true;
              }
            }
            else {
              bVar31 = true;
              if (uVar9 != uVar10) {
                lVar20 = 0;
                do {
                  SVar7 = SzReadNumber32(&local_4e8,(UInt32 *)local_498);
                  if (SVar7 == 0) {
                    if (((uint)local_498[0] < uVar9) &&
                       (*(char *)((long)local_3a8.bufs + (local_498[0] & 0xffffffff)) == '\0')) {
                      *(undefined1 *)((long)local_3a8.bufs + (local_498[0] & 0xffffffff)) = 1;
                      local_458[lVar20] = (uint)local_498[0];
                      bVar31 = true;
                    }
                    else {
                      bVar31 = false;
                      SVar6 = 0x10;
                    }
                  }
                  else {
                    bVar31 = false;
                    SVar6 = SVar7;
                  }
                } while ((bVar31) &&
                        (bVar29 = (ulong)(uVar21 + (uVar21 == 0)) - 1 != lVar20, lVar20 = lVar20 + 1
                        , bVar29));
              }
            }
            goto LAB_00110b02;
          }
        }
        bVar31 = false;
        SVar6 = 4;
      }
LAB_00110b02:
      uVar22 = local_4b0;
      iVar27 = SVar6;
      if (bVar31) {
        local_468 = CONCAT44(local_468._4_4_,uVar8);
        iVar27 = 0;
      }
    }
  }
LAB_00110b25:
  if (iVar27 != 0) {
    return iVar27;
  }
  if (local_4e8.Size != 0) {
    return 0xb;
  }
  if (uStack_460._4_4_ != p->FoToMainUnpackSizeIndex[uVar22]) {
    return 0xb;
  }
  if ((ISzAlloc *)
      p->CoderUnpackSizes
      [(uint)p->FoToMainUnpackSizeIndex[uVar22] + p->FoToCoderUnpackSizes[uVar22]] !=
      (ISzAlloc *)outSize) {
    return 0xb;
  }
  local_3d8[0] = (Byte *)0x0;
  local_3d8[1] = (Byte *)0x0;
  local_3c8 = (ISzAlloc *)0x0;
  local_4d0 = p->PackPositions + p->FoStartPackStreamIndex[uVar22];
  local_488 = 0;
  local_498[0] = 0;
  local_498[1] = 0;
  uVar12 = local_468 & 0xffffffff;
  local_51c = 4;
  if (((3 < (int)local_468 - 1U) || (local_430.Free._4_1_ != '\x01')) ||
     (((int)local_430.Free != 0 &&
      (((int)local_430.Free != 0x30101 && ((int)local_430.Free != 0x21)))))) goto LAB_00110f49;
  if ((int)local_468 == 4) {
    if ((((local_414 != '\x01') ||
         ((((local_418 != 0 && (local_418 != 0x30101)) && (local_418 != 0x21)) ||
          (local_404 != '\x01')))) ||
        (((local_408 != 0 && (local_408 != 0x30101)) && (local_408 != 0x21)))) ||
       ((((((local_3f8 != 0x303011b || (local_3f4 != '\x04')) ||
           (((int)uStack_460 != 4 ||
            (((local_458[0] != 2 || (local_458[1] != 6)) || (local_458[2] != 1)))))) ||
          ((local_458[3] != 0 || (local_468._4_4_ != 3)))) || (local_448[0] != 5)) ||
        (((local_448[1] != 0 || (local_448[2] != 4)) || ((local_448[3] != 1 || (local_448[4] != 3)))
         ))))) goto LAB_00110f49;
    iVar27 = local_434 + -2;
  }
  else {
    if ((int)local_468 == 2) {
      if (((local_414 == '\x01') && ((int)uStack_460 == 1)) &&
         (((local_458[0] == 0 && ((local_468._4_4_ == 1 && (local_448[0] == 1)))) &&
          (local_448[1] == 0)))) {
        if (local_418 < 0x3030401) {
          if (((local_418 != 3) && (local_418 != 0x3030103)) && (local_418 != 0x3030205))
          goto LAB_00110f49;
        }
        else if (local_418 < 0x3030701) {
          if ((local_418 != 0x3030401) && (local_418 != 0x3030501)) goto LAB_00110f49;
        }
        else if ((local_418 != 0x3030805) && (local_418 != 0x3030701)) goto LAB_00110f49;
        local_51c = 0;
      }
      goto LAB_00110f49;
    }
    if ((((int)local_468 != 1) || ((int)uStack_460 != 1)) ||
       (iVar27 = local_468._4_4_, local_458[0] != 0)) goto LAB_00110f49;
  }
  local_51c = (uint)(iVar27 != 0) << 2;
LAB_00110f49:
  if (local_51c == 0) {
    if ((int)local_468 != 0) {
      local_3b0 = p->CoderUnpackSizes + p->FoToCoderUnpackSizes[uVar22];
      local_3b8 = outBuffer + outSize;
      uVar25 = 0;
      local_478 = (ISzAlloc *)0x0;
      local_3e8 = (ISzAlloc *)0x0;
      local_4f8 = (ISzAlloc *)outSize;
      local_4f0 = p;
      local_4b0 = uVar22;
      do {
        pIVar14 = &local_430 + uVar25;
        uVar8 = *(uint *)&(&local_430)[uVar25].Free;
        if ((int)uVar8 < 0x30101) {
          if ((uVar8 == 0) || (uVar8 == 0x21)) {
LAB_00111115:
            uVar22 = 0;
            pIVar17 = (ISzAlloc *)outSize;
            pIVar15 = (ISzAlloc *)outBuffer;
            local_4b8 = pIVar14;
            if ((int)uVar12 == 4) {
              pIVar17 = (ISzAlloc *)local_3b0[uVar25];
              uVar22 = (ulong)*(uint *)(&DAT_0011f024 + uVar25 * 4);
              pIVar15 = (ISzAlloc *)outBuffer;
              if (uVar25 < 2) {
                pIVar14 = (ISzAlloc *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)pIVar17);
                bVar31 = pIVar14 == (ISzAlloc *)0x0;
                if (pIVar17 != (ISzAlloc *)0x0 && bVar31) {
                  local_51c = 2;
                }
                else {
                  uVar12 = (ulong)(uint)((1 - (int)uVar25) * 8);
                  *(ISzAlloc **)((long)local_3d8 + uVar12) = pIVar14;
                  *(ISzAlloc **)((long)local_498 + uVar12) = pIVar17;
                  pIVar15 = pIVar14;
                }
                bVar31 = pIVar17 == (ISzAlloc *)0x0 || (!bVar31 || pIVar14 != (ISzAlloc *)0x0);
                outSize = (size_t)local_4f8;
              }
              else {
                if (uVar25 == 2) {
                  if (pIVar17 <= outSize) {
                    pIVar15 = (ISzAlloc *)(outBuffer + (outSize - (long)pIVar17));
                    bVar31 = true;
                    local_3e8 = pIVar15;
                    local_478 = pIVar17;
                    goto LAB_001112f8;
                  }
                  local_51c = 5;
                }
                else {
                  local_51c = 4;
                }
                bVar31 = false;
                pIVar17 = (ISzAlloc *)outSize;
              }
LAB_001112f8:
              uVar8 = local_51c;
              if (bVar31) goto LAB_00111315;
              goto LAB_00111e70;
            }
LAB_00111315:
            local_4d8 = pIVar15;
            local_500 = pIVar17;
            pIVar5 = local_4a0;
            UVar2 = local_4d0[uVar22];
            UVar3 = local_4d0[(int)uVar22 + 1];
            local_3a8.bufs[0] = (Byte *)(local_3e0 + UVar2);
            uVar8 = (*local_4a0->Seek)(local_4a0,(Int64 *)&local_3a8,SZ_SEEK_SET);
            pBVar4 = local_138;
            p = local_4f0;
            if (uVar8 == 0) {
              pIVar14 = (ISzAlloc *)(UVar3 - UVar2);
              iVar27 = *(int *)&local_4b8->Free;
              if (iVar27 == 0x30101) {
                local_3a8.bufs[2] = (Byte *)0x0;
                local_3a8.bufs[3] = (Byte *)0x0;
                uVar8 = LzmaDec_AllocateProbs
                                  ((CLzmaDec *)&local_3a8,
                                   (Byte *)((long)&local_4a8->Alloc + (long)local_4b8->Alloc),
                                   (uint)*(byte *)((long)&local_4b8->Free + 5),local_4b8);
                p = local_4f0;
                if (uVar8 == 0) {
                  local_3a8.bufs[3] = (Byte *)local_4d8;
                  local_3a8.lims[3] = (Byte *)local_500;
                  local_3a8.lims[2] = (Byte *)0x0;
                  local_3a8.range = 0;
                  local_3a8.code = 1;
                  local_3a8.probs[4] = 0;
                  local_3a8.probs[5] = 0;
                  local_3a8.dest = (Byte *)0x0;
                  local_3a8.probs[0] = 1;
                  local_3a8.probs[1] = 0;
                  pIVar17 = local_500;
                  do {
                    local_138 = (Byte *)0x0;
                    local_4c0 = (ISzAlloc *)0x40000;
                    if (pIVar14 < (ISzAlloc *)0x40000) {
                      local_4c0 = pIVar14;
                    }
                    uVar8 = (*pIVar5->Look)(pIVar5,(void **)&local_138,(size_t *)&local_4c0);
                    pBVar4 = local_3a8.lims[2];
                    if (uVar8 == 0) {
                      local_4c8 = local_4c0;
                      uVar8 = LzmaDec_DecodeToDic((CLzmaDec *)&local_3a8,(SizeT)pIVar17,local_138,
                                                  (SizeT *)&local_4c8,LZMA_FINISH_END,&local_504);
                      local_4c0 = (ISzAlloc *)((long)local_4c0 - (long)local_4c8);
                      pIVar14 = (ISzAlloc *)((long)pIVar14 - (long)local_4c8);
                      pIVar17 = local_500;
                      if (uVar8 == 0) {
                        if (local_504 != LZMA_STATUS_FINISHED_WITH_MARK) {
                          if ((local_504 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                             ((ISzAlloc *)local_3a8.lims[2] == local_500)) {
                            uVar8 = 0;
                            bVar31 = false;
                            if (pIVar14 == (ISzAlloc *)0x0) goto LAB_00111ccd;
                          }
                          if ((local_4c8 == (ISzAlloc *)0x0) && (pBVar4 == local_3a8.lims[2])) {
                            bVar31 = false;
                            uVar8 = 1;
                          }
                          else {
                            uVar8 = (*pIVar5->Skip)(pIVar5,(size_t)local_4c8);
                            bVar31 = uVar8 == 0;
                            pIVar17 = local_500;
                          }
                          goto LAB_00111ccd;
                        }
                        uVar8 = (uint)((ISzAlloc *)local_3a8.lims[2] != local_500 ||
                                      pIVar14 != (ISzAlloc *)0x0);
                      }
                      bVar31 = false;
                    }
                    else {
                      bVar31 = false;
                    }
LAB_00111ccd:
                  } while (bVar31);
                  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_3a8.bufs[2]);
                  local_3a8.bufs[2] = (Byte *)0x0;
                }
                outSize = (size_t)local_4f8;
                if (uVar8 != 0) goto LAB_0011136e;
LAB_00111eb5:
                bVar31 = true;
              }
              else {
                if (iVar27 == 0x21) {
                  local_3a8.bufs[2] = (Byte *)0x0;
                  local_3a8.bufs[3] = (Byte *)0x0;
                  uVar8 = 1;
                  if (*(char *)((long)&local_4b8->Free + 5) == '\x01') {
                    bVar16 = *(byte *)((long)&local_4a8->Alloc + (long)local_4b8->Alloc);
                    uVar8 = 4;
                    uVar9 = (uint)bVar16;
                    pIVar17 = local_4a8;
                    if (uVar9 < 0x29) {
                      uVar8 = 0xffffffff;
                      if (uVar9 != 0x28) {
                        uVar8 = (uVar9 & 1 | 2) << ((bVar16 >> 1) + 0xb & 0x1f);
                      }
                      pIVar17 = (ISzAlloc *)(ulong)(uVar8 >> 0x10);
                      local_138._0_4_ =
                           CONCAT13((char)(uVar8 >> 0x10),
                                    CONCAT12((char)(uVar8 >> 8),CONCAT11((char)uVar8,4)));
                      local_138._5_3_ = SUB83(pBVar4,5);
                      local_138._0_5_ = CONCAT14((char)(uVar8 >> 0x18),(uint)local_138);
                      uVar8 = 0;
                    }
                    if (bVar16 < 0x29) {
                      uVar8 = LzmaDec_AllocateProbs
                                        ((CLzmaDec *)&local_3a8,(Byte *)&local_138,5,pIVar17);
                    }
                    if (uVar8 == 0) {
                      local_3a8.bufs[3] = (Byte *)local_4d8;
                      local_3a8.lims[3] = (Byte *)local_500;
                      local_3a8.probs[0x16] = 0;
                      local_3a8.probs[0x17] = 0;
                      local_3a8.probs[0x1a] = 1;
                      local_3a8.probs[0x1b] = 0;
                      local_3a8.probs[0x1c] = 1;
                      local_3a8.probs[0x1d] = 0;
                      local_3a8.probs[0x1e] = 1;
                      local_3a8.probs[0x1f] = 0;
                      local_3a8.lims[2] = (Byte *)0x0;
                      local_3a8.range = 0;
                      local_3a8.code = 1;
                      local_3a8.probs[4] = 0;
                      local_3a8.probs[5] = 0;
                      local_3a8.dest = (Byte *)0x0;
                      local_3a8.probs[0] = 1;
                      local_3a8.probs[1] = 0;
                      pIVar17 = local_500;
                      do {
                        local_4c0 = (ISzAlloc *)0x0;
                        local_4c8 = (ISzAlloc *)0x40000;
                        if (pIVar14 < (ISzAlloc *)0x40000) {
                          local_4c8 = pIVar14;
                        }
                        uVar9 = (*local_4a0->Look)(local_4a0,&local_4c0,(size_t *)&local_4c8);
                        if (uVar9 == 0) {
                          local_4d8 = (ISzAlloc *)local_3a8.lims[2];
                          local_504 = LZMA_STATUS_NOT_SPECIFIED;
                          pIVar15 = (ISzAlloc *)0x0;
                          if (local_3a8.probs._44_4_ != 8) {
                            local_4b8 = local_4c8;
                            src = local_4c0;
                            pIVar28 = local_4c8;
                            do {
                              pBVar4 = local_3a8.lims[2];
                              bVar31 = true;
                              if (local_3a8.probs._44_4_ == 9) {
LAB_0011160e:
                                bVar31 = true;
                                uVar9 = local_3a8.probs._36_4_;
                                uVar10 = 1;
                              }
                              else {
                                uVar9 = local_3a8.probs._36_4_;
                                if ((local_3a8.probs._44_4_ & 0xfffffffe) == 6) {
                                  pBVar23 = (Byte *)((long)pIVar17 - (long)local_3a8.lims[2]);
                                  local_138 = (Byte *)((long)pIVar28 - (long)pIVar15);
                                  pBVar18 = (Byte *)(ulong)(uint)local_3a8.probs._40_4_;
                                  pBVar24 = pBVar23;
                                  if (pBVar18 <= pBVar23) {
                                    pBVar24 = pBVar18;
                                  }
                                  if ((char)(byte)local_3a8.probs[0x18] < '\0') {
                                    if (local_3a8.probs._44_4_ == 6) {
                                      bVar16 = (byte)local_3a8.probs[0x18] >> 5 & 3;
                                      local_3a8.probs._44_4_ = 9;
                                      if (((bVar16 == 3) || (local_3a8.probs._52_4_ == 0)) &&
                                         ((bVar16 != 0 || (local_3a8.probs._56_4_ == 0)))) {
                                        local_3a8.range = 0;
                                        local_3a8.code = 1;
                                        local_3a8.probs[4] = 0;
                                        local_3a8.probs[5] = 0;
                                        if (bVar16 == 3) {
                                          local_3a8.dest = (Byte *)0x0;
                                          local_3a8.probs[0] = 1;
                                          local_3a8.probs[1] = 0;
                                        }
                                        if (bVar16 != 0) {
                                          local_3a8.probs[0] = 1;
                                          local_3a8.probs[1] = 0;
                                        }
                                        local_3a8.probs[0x1a] = 0;
                                        local_3a8.probs[0x1b] = 0;
                                        local_3a8.probs[0x1c] = 0;
                                        local_3a8.probs[0x1d] = 0;
                                        bVar29 = true;
                                        local_3a8.probs._44_4_ = 7;
                                      }
                                      else {
                                        bVar29 = false;
                                        uVar8 = 1;
                                      }
                                      bVar31 = true;
                                      uVar10 = uVar8;
                                      if (!bVar29) goto LAB_00111614;
                                    }
                                    if ((Byte *)(ulong)(uint)local_3a8.probs._36_4_ < local_138) {
                                      local_138 = (Byte *)(ulong)(uint)local_3a8.probs._36_4_;
                                    }
                                    uVar10 = LzmaDec_DecodeToDic((CLzmaDec *)&local_3a8,
                                                                 (SizeT)(pBVar24 +
                                                                        (long)local_3a8.lims[2]),
                                                                 (Byte *)src,&local_138,
                                                                 (uint)(pBVar18 <= pBVar23),
                                                                 &local_504);
                                    src = (ISzAlloc *)((long)&src->Alloc + (long)local_138);
                                    pIVar15 = (ISzAlloc *)((long)&pIVar15->Alloc + (long)local_138);
                                    uVar9 = local_3a8.probs._36_4_ - (uint)local_138;
                                    local_3a8.probs._40_4_ =
                                         ((int)pBVar4 - (int)local_3a8.lims[2]) +
                                         local_3a8.probs._40_4_;
                                    bVar31 = true;
                                    pIVar17 = local_500;
                                    pIVar28 = local_4b8;
                                    if (uVar10 == 0) {
                                      if (local_504 == LZMA_STATUS_NEEDS_MORE_INPUT) {
                                        uVar10 = 0;
                                      }
                                      else {
                                        if (local_138 == (Byte *)0x0 && pBVar4 == local_3a8.lims[2])
                                        {
                                          if (local_3a8.probs._36_4_ != (uint)local_138 ||
                                              (local_504 != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
                                              || local_3a8.probs._40_4_ != 0)) {
                                            local_3a8.probs[0x16] = 9;
                                            local_3a8.probs[0x17] = 0;
                                            local_3a8.probs._36_4_ = uVar9;
                                            goto LAB_0011160e;
                                          }
                                          local_3a8.probs[0x16] = 0;
                                          local_3a8.probs[0x17] = 0;
                                        }
                                        bVar31 = false;
                                        uVar10 = uVar8;
                                        if (local_504 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) {
                                          local_504 = LZMA_STATUS_NOT_FINISHED;
                                        }
                                      }
                                    }
                                  }
                                  else if (pIVar28 == pIVar15) {
                                    local_504 = LZMA_STATUS_NEEDS_MORE_INPUT;
                                    bVar31 = true;
                                    uVar10 = 0;
                                  }
                                  else {
                                    if (local_3a8.probs._44_4_ == 6) {
                                      if ((byte)local_3a8.probs[0x18] == 1) {
                                        local_3a8.probs[0x1c] = 1;
                                        local_3a8.probs[0x1d] = 0;
                                        local_3a8.probs[0x1e] = 1;
                                        local_3a8.probs[0x1f] = 0;
LAB_0011177f:
                                        local_3a8.probs[0x1a] = 0;
                                        local_3a8.probs[0x1b] = 0;
                                        local_3a8.range = 0;
                                        local_3a8.code = 1;
                                        local_3a8.probs[4] = 0;
                                        local_3a8.probs[5] = 0;
                                        bVar29 = true;
                                        if ((byte)local_3a8.probs[0x18] == 1) {
                                          local_3a8.dest = (Byte *)0x0;
                                          local_3a8.probs[0] = 1;
                                          local_3a8.probs[1] = 0;
                                        }
                                      }
                                      else {
                                        if (local_3a8.probs._52_4_ == 0) goto LAB_0011177f;
                                        local_3a8.probs[0x16] = 9;
                                        local_3a8.probs[0x17] = 0;
                                        uVar8 = 1;
                                        bVar29 = false;
                                      }
                                      bVar31 = true;
                                      uVar10 = uVar8;
                                      if (!bVar29) goto LAB_00111614;
                                    }
                                    if (pBVar24 < local_138) {
                                      local_138 = pBVar24;
                                    }
                                    pBVar4 = local_138;
                                    if (local_138 == (Byte *)0x0) {
                                      local_3a8.probs[0x16] = 9;
                                      local_3a8.probs[0x17] = 0;
                                      bVar31 = true;
                                      pIVar17 = local_500;
                                      uVar10 = 1;
                                    }
                                    else {
                                      memcpy((Byte *)((long)(_func_void_ptr_void_ptr_size_t **)
                                                            local_3a8.lims[2] +
                                                     (long)local_3a8.bufs[3]),src,(size_t)local_138)
                                      ;
                                      local_3a8.lims[2] =
                                           (Byte *)((long)(_func_void_ptr_void_ptr_size_t **)
                                                          local_3a8.lims[2] + (long)pBVar4);
                                      if (local_3a8.dest._4_4_ == 0) {
                                        if ((Byte *)(ulong)(uint)(local_3a8.bufs[1]._4_4_ -
                                                                 (int)local_3a8.dest) <= pBVar4) {
                                          local_3a8.dest =
                                               (Byte *)CONCAT44(local_3a8.bufs[1]._4_4_,
                                                                (int)local_3a8.dest);
                                        }
                                      }
                                      local_3a8.dest =
                                           (Byte *)CONCAT44(local_3a8.dest._4_4_,
                                                            (int)local_3a8.dest + (int)pBVar4);
                                      src = (ISzAlloc *)((long)&src->Alloc + (long)pBVar4);
                                      pIVar15 = (ISzAlloc *)((long)&pIVar15->Alloc + (long)pBVar4);
                                      bVar31 = false;
                                      local_3a8.probs._40_4_ = local_3a8.probs._40_4_ - (int)pBVar4;
                                      pIVar17 = local_500;
                                      pIVar28 = local_4b8;
                                      uVar9 = local_3a8.probs._36_4_;
                                      local_3a8.probs._44_4_ = 7;
                                      uVar10 = uVar8;
                                      if (local_3a8.probs._40_4_ == 0) {
                                        local_3a8.probs._44_4_ = 0;
                                      }
                                    }
                                  }
                                }
                                else if (pIVar28 == pIVar15) {
                                  local_504 = LZMA_STATUS_NEEDS_MORE_INPUT;
                                  uVar10 = 0;
                                }
                                else {
                                  uVar10 = 9;
                                  if ((uint)local_3a8.probs._44_4_ < 6) {
                                    bVar16 = *(byte *)&src->Alloc;
                                    uVar9 = (uint)bVar16;
                                    switch(local_3a8.probs._44_4_) {
                                    case (BADTYPE)0x0:
                                      local_3a8.probs[0x18]._0_1_ = bVar16;
                                      if (bVar16 == 0) {
                                        uVar10 = 8;
                                      }
                                      else {
                                        if ((char)bVar16 < '\0') {
                                          local_3a8.probs._40_4_ = (bVar16 & 0x1f) << 0x10;
                                        }
                                        else {
                                          if (2 < bVar16) break;
                                          local_3a8.probs[0x14] = 0;
                                          local_3a8.probs[0x15] = 0;
                                        }
                                        uVar10 = 1;
                                      }
                                      break;
                                    case (BADTYPE)0x1:
                                      local_3a8.probs._40_4_ =
                                           local_3a8.probs._40_4_ | (uint)bVar16 << 8;
                                      uVar10 = 2;
                                      break;
                                    case (BADTYPE)0x2:
                                      local_3a8.probs._40_4_ = (uVar9 | local_3a8.probs._40_4_) + 1;
                                      uVar10 = (uint)(-1 < (char)(byte)local_3a8.probs[0x18]) * 3 +
                                               3;
                                      break;
                                    case (BADTYPE)0x3:
                                      local_3a8.probs._36_4_ = uVar9 << 8;
                                      uVar10 = 4;
                                      break;
                                    case (BADTYPE)0x4:
                                      local_3a8.probs._36_4_ = (uVar9 | local_3a8.probs._36_4_) + 1;
                                      uVar10 = 5;
                                      if (((byte)local_3a8.probs[0x18] & 0x40) == 0) {
                                        uVar10 = (uint)(local_3a8.probs._60_4_ != 0) * 3 + 6;
                                      }
                                      break;
                                    case (BADTYPE)0x5:
                                      if (bVar16 < 0xe1) {
                                        uVar9 = uVar9 / 9;
                                        uVar21 = (uint)(byte)(bVar16 + (char)uVar9 * -9);
                                        local_3a8.bufs[1] =
                                             (Byte *)CONCAT44(local_3a8.bufs[1]._4_4_,uVar9 / 5);
                                        if (uVar9 % 5 + uVar21 < 5) {
                                          local_3a8.bufs[0] = (Byte *)CONCAT44(uVar9 % 5,uVar21);
                                          local_3a8.probs[0x1e] = 0;
                                          local_3a8.probs[0x1f] = 0;
                                          uVar10 = 6;
                                        }
                                      }
                                    }
                                  }
                                  pIVar15 = (ISzAlloc *)((long)&pIVar15->Alloc + 1);
                                  src = (ISzAlloc *)((long)&src->Alloc + 1);
                                  bVar29 = pIVar17 == (ISzAlloc *)local_3a8.lims[2];
                                  bVar30 = uVar10 != 8;
                                  if (bVar30 && bVar29) {
                                    uVar10 = 9;
                                  }
                                  bVar31 = bVar30 && bVar29;
                                  uVar9 = local_3a8.probs._36_4_;
                                  local_3a8.probs._44_4_ = uVar10;
                                  uVar10 = uVar8;
                                  if (bVar30 && bVar29) {
                                    uVar10 = 1;
                                  }
                                }
                              }
LAB_00111614:
                              uVar8 = uVar10;
                              local_3a8.probs._36_4_ = uVar9;
                              if (bVar31) goto LAB_001115c3;
                            } while (local_3a8.probs._44_4_ != 8);
                          }
                          local_504 = LZMA_STATUS_FINISHED_WITH_MARK;
                          uVar8 = 0;
LAB_001115c3:
                          local_4c8 = (ISzAlloc *)((long)local_4c8 - (long)pIVar15);
                          pIVar14 = (ISzAlloc *)((long)pIVar14 - (long)pIVar15);
                          uVar9 = uVar8;
                          if (uVar8 != 0) goto LAB_001115f0;
                          if (local_504 == LZMA_STATUS_FINISHED_WITH_MARK) {
                            uVar9 = (uint)((ISzAlloc *)local_3a8.lims[2] != pIVar17 ||
                                          pIVar14 != (ISzAlloc *)0x0);
                            goto LAB_001115f0;
                          }
                          if ((pIVar15 == (ISzAlloc *)0x0) &&
                             (local_4d8 == (ISzAlloc *)local_3a8.lims[2])) {
                            bVar31 = false;
                            uVar8 = 1;
                          }
                          else {
                            uVar8 = (*local_4a0->Skip)(local_4a0,(size_t)pIVar15);
                            bVar31 = uVar8 == 0;
                          }
                        }
                        else {
LAB_001115f0:
                          uVar8 = uVar9;
                          bVar31 = false;
                        }
                      } while (bVar31);
                      (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_3a8.bufs[2]);
                      local_3a8.bufs[2] = (Byte *)0x0;
                      outSize = (size_t)local_4f8;
                    }
                  }
                  if (uVar8 == 0) goto LAB_00111eb5;
                }
                else if (iVar27 == 0) {
                  if (pIVar14 == local_500) {
                    uVar8 = SzDecodeCopy((UInt64)pIVar14,pIVar5,(Byte *)local_4d8);
                    if (uVar8 == 0) goto LAB_00111eb5;
                    bVar31 = false;
                    local_51c = uVar8;
                    goto LAB_00111e72;
                  }
                  uVar8 = 1;
                }
                else {
                  uVar8 = 4;
                }
LAB_00111e70:
                local_51c = uVar8;
                bVar31 = false;
              }
            }
            else {
LAB_0011136e:
              bVar31 = false;
              local_51c = uVar8;
            }
LAB_00111e72:
            uVar22 = local_4b0;
            if (bVar31) {
LAB_00111e7c:
              bVar31 = true;
            }
            else {
              bVar31 = false;
            }
          }
          else {
LAB_00110fdb:
            if (uVar25 == 1) {
              if (uVar8 != 3) {
                if (acStack_413[0] != '\0') goto LAB_00111277;
                bVar31 = false;
                UVar11 = (UInt32)&local_430;
                if ((int)uVar8 < 0x3030501) {
                  if (uVar8 == 0x3030103) {
                    local_3a8.bufs[0] = (Byte *)((ulong)local_3a8.bufs[0] & 0xffffffff00000000);
                    x86_Convert(outBuffer,outSize,(UInt32)&local_3a8,(UInt32 *)(ulong)uVar8,
                                local_51c);
                  }
                  else if (uVar8 == 0x3030205) {
                    PPC_Convert(outBuffer,outSize,UVar11,0x3030205);
                  }
                  else {
                    if (uVar8 != 0x3030401) {
LAB_0011203f:
                      local_51c = 4;
                      goto LAB_00111e89;
                    }
                    IA64_Convert(outBuffer,outSize,UVar11,0x3030401);
                  }
                }
                else if (uVar8 == 0x3030501) {
                  ARM_Convert(outBuffer,outSize,UVar11,0x3030501);
                }
                else if (uVar8 == 0x3030701) {
                  ARMT_Convert(outBuffer,outSize,UVar11,0x3030701);
                }
                else {
                  if (uVar8 != 0x3030805) goto LAB_0011203f;
                  SPARC_Convert(outBuffer,outSize,UVar11,0x3030805);
                }
                goto LAB_00111e7c;
              }
              uVar12 = 0;
              if (acStack_413[0] == '\x01') {
                memset(&local_138,0,0x100);
                __n = (ulong)*(byte *)((long)&local_4a8->Alloc + (long)pIVar14->Alloc) + 1;
                memcpy(&local_3a8,&local_138,__n);
                if ((ISzAlloc *)outSize != (ISzAlloc *)0x0) {
                  uVar13 = 0;
                  pIVar14 = (ISzAlloc *)0x0;
                  do {
                    BVar19 = outBuffer[(long)pIVar14] + *(char *)((long)local_3a8.bufs + uVar13);
                    pIVar17 = (ISzAlloc *)((long)&pIVar14->Alloc + 1);
                    uVar12 = uVar13 + 1;
                    uVar26 = 0;
                    if (pIVar17 < outSize) {
                      uVar26 = uVar12;
                    }
                    outBuffer[(long)pIVar14] = BVar19;
                    if (__n <= uVar12) {
                      uVar26 = 0;
                    }
                    *(Byte *)((long)local_3a8.bufs + uVar13) = BVar19;
                    uVar13 = uVar26;
                    pIVar14 = pIVar17;
                  } while (pIVar17 < outSize);
                }
                __n_00 = uVar12 & 0xffffffff;
                if ((int)uVar12 == (int)__n) {
                  __n_00 = 0;
                }
                memcpy(&local_138,(void *)((long)local_3a8.bufs + __n_00),
                       (ulong)(uint)((int)__n - (int)__n_00));
                if ((int)__n_00 != 0) {
                  memcpy((void *)((long)&local_138 + (__n - __n_00)),&local_3a8,__n_00);
                }
                goto LAB_00111e7c;
              }
            }
LAB_00111277:
            bVar31 = false;
            local_51c = 4;
          }
        }
        else {
          if (uVar8 != 0x303011b) {
            if (uVar8 == 0x30101) goto LAB_00111115;
            goto LAB_00110fdb;
          }
          if (uVar25 == 3) {
            UVar2 = local_4d0[1];
            UVar3 = local_4d0[2];
            inSize = UVar3 - UVar2;
            local_488 = inSize;
            pIVar14 = (ISzAlloc *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,inSize);
            pIVar5 = local_4a0;
            local_3c8 = pIVar14;
            if (pIVar14 == (ISzAlloc *)0x0 && UVar3 != UVar2) {
              uVar8 = 2;
            }
            else {
              local_3a8.bufs[0] = (Byte *)(UVar2 + local_3e0);
              uVar8 = (*local_4a0->Seek)(local_4a0,(Int64 *)&local_3a8,SZ_SEEK_SET);
              if (uVar8 == 0) {
                uVar8 = SzDecodeCopy(inSize,pIVar5,(Byte *)pIVar14);
                outSize = (size_t)local_4f8;
                p = local_4f0;
                if (uVar8 == 0) {
                  if ((((local_498[0] & 3) == 0) && ((local_498[1] & 3) == 0)) &&
                     ((ISzAlloc *)((long)&local_478->Alloc + local_498[1] + local_498[0]) ==
                      local_4f8)) {
                    local_3a8.bufs[0] = (Byte *)local_3e8;
                    local_3a8.lims[0] = (Byte *)((long)&local_478->Alloc + (long)local_3e8);
                    local_3a8.bufs[1] = local_3d8[0];
                    local_3a8.lims[1] = local_3d8[0] + local_498[0];
                    local_3a8.bufs[2] = local_3d8[1];
                    local_3a8.lims[2] = local_3d8[1] + local_498[1];
                    local_3a8.lims[3] = (Byte *)((long)pIVar14 + inSize);
                    local_3a8.destLim = local_3b8;
                    local_3a8.state = 9;
                    local_3a8.ip = 0;
                    local_3a8.temp[3] = '\0';
                    local_3a8.range = 0;
                    local_3a8.code = 0;
                    lVar20 = 0x32;
                    do {
                      *(undefined2 *)((long)local_3a8.bufs + lVar20 * 2) = 0x400;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 0x134);
                    local_3a8.bufs[3] = (Byte *)pIVar14;
                    local_3a8.dest = outBuffer;
                    uVar8 = Bcj2Dec_Decode(&local_3a8);
                    p = local_4f0;
                    if (uVar8 == 0) {
                      lVar20 = -0x20;
                      do {
                        if (*(long *)((long)local_3a8.lims + lVar20) !=
                            *(long *)(local_3a8.temp + lVar20 + -0x18)) goto LAB_001120a7;
                        lVar20 = lVar20 + 8;
                      } while (lVar20 != 0);
                      if (local_3a8.code == 0) {
                        bVar31 = local_3a8.state == 0 && local_3a8.dest == local_3a8.destLim;
                        if (local_3a8.state != 0 || local_3a8.dest != local_3a8.destLim) {
                          local_51c = 1;
                        }
                      }
                      else {
LAB_001120a7:
                        bVar31 = false;
                        local_51c = 1;
                      }
                    }
                    else {
                      bVar31 = false;
                      local_51c = uVar8;
                    }
                  }
                  else {
                    bVar31 = false;
                    local_51c = 1;
                  }
                }
                else {
                  bVar31 = false;
                  local_51c = uVar8;
                }
                goto LAB_001112d0;
              }
            }
            bVar31 = false;
            outSize = (size_t)local_4f8;
            p = local_4f0;
            local_51c = uVar8;
          }
          else {
            bVar31 = false;
            local_51c = 4;
          }
LAB_001112d0:
          if (bVar31) goto LAB_00111e7c;
          bVar31 = false;
        }
LAB_00111e89:
        if (!bVar31) goto LAB_00112108;
        uVar25 = uVar25 + 1;
        uVar12 = local_468 & 0xffffffff;
      } while (uVar25 < uVar12);
    }
    local_51c = 0;
  }
LAB_00112108:
  lVar20 = 0;
  do {
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_3d8[lVar20]);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  if (local_51c == 0) {
    pBVar4 = (p->FolderCRCs).Defs;
    local_51c = 0;
    if ((pBVar4 != (Byte *)0x0) && ((char)(pBVar4[local_46c >> 3] << ((byte)local_46c & 7)) < '\0'))
    {
      UVar11 = (*g_CrcUpdate)(0xffffffff,outBuffer,outSize,g_CrcTable);
      local_51c = (uint)((UVar11 ^ (p->FolderCRCs).Vals[uVar22]) != 0xffffffff) * 3;
    }
  }
  return local_51c;
}

Assistant:

static SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}